

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O2

FT_Error af_latin_metrics_init(AF_LatinMetrics metrics,FT_Face face)

{
  AF_LatinAxisRec *pAVar1;
  AF_WidthRec *table;
  char *pcVar2;
  ushort uVar3;
  FT_Memory pFVar4;
  FT_GlyphSlot_conflict pFVar5;
  undefined1 *puVar6;
  long lVar7;
  long *plVar8;
  uint uVar9;
  char cVar10;
  FT_Error FVar11;
  long *plVar12;
  ulong uVar13;
  void *buf_;
  uint *p;
  FT_ULong FVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  FT_Pos *pFVar19;
  ulong uVar20;
  ushort uVar21;
  FT_UInt FVar22;
  uint idx;
  AF_LatinBlueRec *pAVar23;
  uint uVar24;
  uint uVar25;
  FT_Face pFVar26;
  FT_CharMap charmap;
  uint uVar27;
  long lVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  long *plVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long *plVar41;
  char *pcVar42;
  AF_Blue_StringRec *pAVar43;
  ulong uVar44;
  AF_LatinMetrics metrics_00;
  bool bVar45;
  bool bVar46;
  uint auStack_c3c8 [2];
  AF_LatinMetricsRec dummy [1];
  AF_GlyphHintsRec hints [1];
  FT_UInt local_168 [2];
  uint num_idx_1;
  long local_110;
  long local_108;
  ulong local_100;
  ulong local_f8;
  undefined1 *local_f0;
  ulong local_e8;
  FT_CharMap local_e0;
  ulong local_d8;
  AF_LatinBlueRec *local_d0;
  FT_UInt local_c8;
  uint local_c4;
  long *local_c0;
  ulong local_b8;
  char *local_b0;
  AF_Blue_StringRec *local_a8;
  char *local_a0;
  uint local_94;
  FT_Vector *local_90;
  FT_Pos *local_88;
  long local_80;
  uint local_74;
  uint local_70;
  uint local_6c;
  ulong local_68;
  FT_Face local_60;
  ulong local_58;
  AF_LatinMetrics local_50;
  AF_LatinAxisRec *local_48;
  undefined1 local_3d;
  FT_UInt local_3c;
  uint local_38;
  uint local_34;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar11 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar11 == 0) {
    pFVar4 = face->memory;
    local_e0 = charmap;
    local_50 = metrics;
    memset(hints,0,0x1430);
    metrics_00 = local_50;
    pAVar1 = local_50->axis;
    local_50->axis[0].width_count = 0;
    local_50->axis[1].width_count = 0;
    pcVar42 = af_script_classes[((local_50->root).style_class)->script]->standard_charstring;
    dummy[0].axis[1].org_delta = (FT_Pos)pFVar4;
    local_60 = face;
    plVar12 = (long *)af_shaper_buf_create(face);
    do {
      cVar10 = *pcVar42;
      if (cVar10 == '\0') {
        lVar28 = 0;
        break;
      }
      while (cVar10 == ' ') {
        pcVar2 = pcVar42 + 1;
        pcVar42 = pcVar42 + 1;
        cVar10 = *pcVar2;
      }
      pcVar42 = af_shaper_get_cluster(pcVar42,&metrics_00->root,plVar12,auStack_c3c8);
    } while ((1 < auStack_c3c8[0]) || (lVar28 = *plVar12, lVar28 == 0));
    af_shaper_buf_destroy(local_60,plVar12);
    if ((lVar28 != 0) &&
       ((FVar11 = FT_Load_Glyph(local_60,(FT_UInt)lVar28,1), FVar11 == 0 &&
        (pFVar5 = local_60->glyph, 0 < (pFVar5->outline).n_points)))) {
      memset(auStack_c3c8,0,0x8fe0);
      dummy[0].root.globals._0_4_ = metrics_00->units_per_em;
      dummy[0].root.scaler.face = (FT_Face)0x10000;
      dummy[0].root.scaler.x_scale = 0x10000;
      dummy[0].root.scaler.y_scale = 0;
      dummy[0].root.scaler.x_delta = 0;
      dummy[0].root.style_class = (AF_StyleClass)local_60;
      hints[0].axis[1].embedded.edges[0xb].last._0_4_ = 0;
      hints[0]._5144_8_ = auStack_c3c8;
      FVar11 = af_glyph_hints_reload((AF_GlyphHints)&dummy[0].axis[1].org_delta,&pFVar5->outline);
      if (FVar11 == 0) {
        pFVar19 = &dummy[0].axis[1].org_delta;
        local_48 = pAVar1;
        for (lVar28 = 0; pAVar1 = local_48, lVar28 != 2; lVar28 = lVar28 + 1) {
          FVar11 = af_latin_hints_compute_segments((AF_GlyphHints)pFVar19,(AF_Dimension)lVar28);
          if (FVar11 != 0) break;
          af_latin_hints_link_segments
                    ((AF_GlyphHints)pFVar19,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar28);
          uVar17 = *(ulong *)(hints[0].axis + lVar28);
          uVar20 = (long)*(int *)&hints[0].axis[lVar28 + -1].embedded.edges[0xb].last * 0x50 +
                   uVar17;
          table = pAVar1[lVar28].widths;
          uVar34 = 0;
          for (; local_168[0] = (FT_UInt)uVar34, uVar17 < uVar20; uVar17 = uVar17 + 0x50) {
            uVar13 = *(ulong *)(uVar17 + 0x20);
            uVar39 = uVar34;
            if ((uVar13 != 0) &&
               ((local_168[0] < 0x10 && uVar17 < uVar13) && uVar17 == *(ulong *)(uVar13 + 0x20))) {
              iVar30 = (int)*(short *)(uVar17 + 2) - (int)*(short *)(uVar13 + 2);
              uVar3 = (ushort)iVar30;
              uVar21 = -uVar3;
              if (0 < iVar30) {
                uVar21 = uVar3;
              }
              uVar39 = (ulong)(local_168[0] + 1);
              table[uVar34].org = (ulong)uVar21;
            }
            uVar34 = uVar39;
          }
          af_sort_and_quantize_widths(local_168,table,(ulong)(FT_UInt)dummy[0].root.globals / 100);
          pAVar1[lVar28].width_count = local_168[0];
          metrics_00 = local_50;
        }
      }
    }
    pFVar26 = local_60;
    for (lVar28 = 0x1f8; lVar28 != 0x9188; lVar28 = lVar28 + 0x47c8) {
      if (*(int *)((long)metrics_00 + lVar28 + -0x198) == 0) {
        uVar17 = (ulong)metrics_00->units_per_em * 0x32 >> 0xb;
      }
      else {
        uVar17 = *(ulong *)((long)metrics_00 + lVar28 + -400);
      }
      *(long *)((long)(metrics_00->axis[0].widths + -5) + lVar28) = (long)uVar17 / 5;
      *(ulong *)((long)metrics_00->axis[0].widths + lVar28 + -0x70) = uVar17;
      *(undefined1 *)((long)metrics_00->axis[0].widths + lVar28 + -0x68) = 0;
    }
    af_glyph_hints_done((AF_GlyphHints)&dummy[0].axis[1].org_delta);
    pAVar43 = af_blue_stringsets + ((metrics_00->root).style_class)->blue_stringset;
    local_f8 = (ulong)metrics_00->units_per_em / 0xe;
    local_c0 = (long *)af_shaper_buf_create(pFVar26);
    local_d0 = metrics_00->axis[1].blues;
    while( true ) {
      uVar25 = 1;
      if ((ulong)pAVar43->string == 0x1429) break;
      local_b0 = af_blue_strings + pAVar43->string;
      lVar31 = 0;
      lVar28 = 0;
      uVar17 = 0;
      local_58 = 0;
      local_a8 = pAVar43;
      while (cVar10 = *local_b0, pcVar42 = local_b0, cVar10 != '\0') {
        while (cVar10 == ' ') {
          cVar10 = pcVar42[1];
          pcVar42 = pcVar42 + 1;
        }
        local_68 = uVar17;
        local_b0 = af_shaper_get_cluster(pcVar42,&local_50->root,local_c0,local_168);
        local_c8 = local_168[0];
        uVar17 = local_68;
        if (local_168[0] != 0) {
          lVar18 = -0x80000000;
          if ((local_a8->properties & 1) == 0) {
            lVar18 = 0x7fffffff;
          }
          local_34 = 0;
          local_74 = (uint)local_a8->properties;
          local_c4 = local_74 & 4;
          FVar22 = 0;
          uVar34 = local_58;
LAB_00232393:
          if (FVar22 != local_c8) {
            if (((*local_c0 != 0) &&
                (local_80 = lVar18, local_3c = FVar22,
                FVar11 = FT_Load_Glyph(pFVar26,(FT_UInt)*local_c0,1), lVar18 = local_80,
                uVar17 = local_68, uVar34 = local_58, FVar22 = local_3c, FVar11 == 0)) &&
               (pFVar5 = pFVar26->glyph, 2 < (pFVar5->outline).n_points)) {
              local_90 = (pFVar5->outline).points;
              local_a0 = (pFVar5->outline).tags;
              uVar25._0_2_ = (pFVar5->outline).n_contours;
              uVar25._2_2_ = (pFVar5->outline).n_points;
              uVar13 = 0;
              uVar20 = (ulong)uVar25;
              if ((short)(undefined2)uVar25 < 1) {
                uVar20 = uVar13;
              }
              local_88 = &local_90->y;
              lVar36 = 0;
              uVar25 = 0;
              local_48 = (AF_LatinAxisRec *)((ulong)local_48 & 0xffffffff00000000);
              local_38 = 0;
              uVar39 = 0xffffffffffffffff;
              while( true ) {
                uVar29 = (uint)uVar39;
                if (uVar13 == (uVar20 & 0xffff)) break;
                uVar24 = (uint)(pFVar5->outline).contours[uVar13];
                if ((int)uVar25 < (int)uVar24) {
                  uVar44 = (ulong)(int)uVar25;
                  if ((local_74 & 3) == 0) {
                    pFVar19 = local_88 + uVar44 * 2;
                    uVar39 = uVar39 & 0xffffffff;
                    for (; uVar16 = (uint)uVar39, (long)uVar44 <= (long)(int)uVar24;
                        uVar44 = uVar44 + 1) {
                      lVar40 = *pFVar19;
                      if (((int)uVar16 < 0) || (lVar40 < lVar36)) {
                        if (lVar40 <= lVar31) {
                          lVar31 = lVar40;
                        }
                        uVar39 = uVar44 & 0xffffffff;
                        lVar36 = lVar40;
                      }
                      else if (lVar28 <= lVar40) {
                        lVar28 = lVar40;
                      }
                      pFVar19 = pFVar19 + 2;
                    }
                  }
                  else {
                    pFVar19 = local_88 + uVar44 * 2;
                    uVar39 = uVar39 & 0xffffffff;
                    for (; uVar16 = (uint)uVar39, (long)uVar44 <= (long)(int)uVar24;
                        uVar44 = uVar44 + 1) {
                      lVar40 = *pFVar19;
                      if (((int)uVar16 < 0) || (lVar36 < lVar40)) {
                        if (lVar28 <= lVar40) {
                          lVar28 = lVar40;
                        }
                        uVar39 = uVar44 & 0xffffffff;
                        lVar36 = lVar40;
                      }
                      else if (lVar40 <= lVar31) {
                        lVar31 = lVar40;
                      }
                      pFVar19 = pFVar19 + 2;
                    }
                  }
                  uVar27 = (uint)local_48;
                  if (uVar16 != uVar29) {
                    uVar27 = uVar24;
                  }
                  local_48 = (AF_LatinAxisRec *)CONCAT44(local_48._4_4_,uVar27);
                  if (uVar16 != uVar29) {
                    local_38 = uVar25;
                  }
                  uVar39 = (ulong)uVar16;
                }
                uVar25 = uVar24 + 1;
                uVar13 = uVar13 + 1;
              }
              pFVar26 = local_60;
              if (-1 < (int)uVar29) {
                local_88 = (FT_Pos *)local_90[uVar39 & 0xffffffff].x;
                uVar20 = 0xffffffffffffffff;
                if ((local_a0[uVar39 & 0xffffffff] & 3U) == 1) {
                  uVar20 = uVar39;
                }
                uVar13 = uVar20 & 0xffffffff;
                uVar44 = uVar39 & 0xffffffff;
                uVar20 = uVar20 & 0xffffffff;
                do {
                  uVar25 = (uint)uVar44;
                  uVar24 = uVar25 - 1;
                  if ((int)uVar25 <= (int)local_38) {
                    uVar24 = (uint)local_48;
                  }
                  uVar37 = local_90[(int)uVar24].y - lVar36;
                  uVar44 = -uVar37;
                  if (0 < (long)uVar37) {
                    uVar44 = uVar37;
                  }
                  if (5 < uVar44) {
                    uVar33 = local_90[(int)uVar24].x - (long)local_88;
                    uVar37 = -uVar33;
                    if (0 < (long)uVar33) {
                      uVar37 = uVar33;
                    }
                    if (uVar37 <= uVar44 * 0x14) break;
                  }
                  uVar25 = (uint)uVar20;
                  if ((int)(uint)uVar20 < 0) {
                    uVar25 = uVar24;
                  }
                  if ((local_a0[(int)uVar24] & 3U) == 1) {
                    uVar13 = (ulong)uVar24;
                    uVar20 = (ulong)uVar25;
                  }
                  uVar44 = (ulong)uVar24;
                  uVar25 = uVar29;
                } while (uVar24 != uVar29);
                uVar44 = uVar39 & 0xffffffff;
                do {
                  uVar16 = (uint)uVar20;
                  uVar27 = (uint)uVar13;
                  uVar24 = (int)uVar44 + 1;
                  if ((int)(uint)local_48 <= (int)uVar44) {
                    uVar24 = local_38;
                  }
                  uVar33 = local_90[(int)uVar24].y - lVar36;
                  uVar37 = -uVar33;
                  if (0 < (long)uVar33) {
                    uVar37 = uVar33;
                  }
                  if (5 < uVar37) {
                    uVar38 = local_90[(int)uVar24].x - (long)local_88;
                    uVar33 = -uVar38;
                    if (0 < (long)uVar38) {
                      uVar33 = uVar38;
                    }
                    if (uVar33 <= uVar37 * 0x14) goto LAB_0023261a;
                  }
                  uVar44 = uVar13;
                  if ((int)uVar27 < 0) {
                    uVar44 = (ulong)uVar24;
                  }
                  bVar45 = (local_a0[(int)uVar24] & 3U) == 1;
                  if (bVar45) {
                    uVar13 = uVar44;
                  }
                  uVar27 = (uint)uVar13;
                  if (bVar45) {
                    uVar20 = (ulong)uVar24;
                  }
                  uVar16 = (uint)uVar20;
                  uVar44 = (ulong)uVar24;
                } while (uVar24 != uVar29);
                uVar44 = uVar39 & 0xffffffff;
LAB_0023261a:
                uVar15 = (uint)uVar44;
                uVar32 = uVar25;
                if ((local_74 & 0x10) != 0) {
                  local_b8 = (ulong)local_50->units_per_em;
                  uVar20 = local_b8 / 0x19;
                  uVar37 = local_90[(int)uVar15].x - local_90[(int)uVar25].x;
                  uVar13 = -uVar37;
                  if (0 < (long)uVar37) {
                    uVar13 = uVar37;
                  }
                  if ((uVar13 < uVar20) &&
                     ((int)((uVar15 - uVar25) + 2) <= (int)((uint)local_48 - local_38))) {
                    uVar39 = uVar39 & 0xffffffff;
                    do {
                      uVar9 = (int)uVar39 - 1;
                      if ((int)uVar39 <= (int)local_38) {
                        uVar9 = (uint)local_48;
                      }
                      uVar39 = (ulong)uVar9;
                      puVar6 = (undefined1 *)local_90[(int)uVar9].x;
                    } while (((FT_Pos *)puVar6 == local_88) && (uVar9 != uVar29));
                    if (uVar9 == uVar29) goto LAB_00232798;
                    local_b8 = (ulong)(local_50->units_per_em >> 2);
                    bVar45 = false;
                    local_70 = 0;
                    local_6c = 0;
                    local_94 = uVar15;
                    do {
                      uVar29 = (uint)uVar44;
                      if (bVar45) {
                        lVar40 = (long)(int)local_94;
                      }
                      else {
                        lVar40 = (long)(int)uVar29;
                        local_94 = uVar29;
                        local_70 = 0xffffffff;
                        local_6c = 0xffffffff;
                        if ((local_a0[lVar40] & 3U) == 1) {
                          local_70 = uVar29;
                          local_6c = uVar29;
                        }
                      }
                      uVar9 = uVar29 + 1;
                      if ((int)(uint)local_48 <= (int)uVar29) {
                        uVar9 = local_38;
                      }
                      uVar44 = (ulong)uVar9;
                      lVar7 = local_90[lVar40].y;
                      uVar39 = lVar36 - lVar7;
                      uVar13 = -uVar39;
                      if (0 < (long)uVar39) {
                        uVar13 = uVar39;
                      }
                      local_f0 = puVar6;
                      local_e8 = uVar20;
                      if (local_b8 < uVar13) {
                        bVar45 = false;
                      }
                      else {
                        local_110 = local_90[(int)uVar9].x;
                        uVar39 = local_90[(int)uVar9].y - lVar7;
                        uVar13 = -uVar39;
                        if (0 < (long)uVar39) {
                          uVar13 = uVar39;
                        }
                        lVar40 = local_90[lVar40].x;
                        uVar37 = local_110 - lVar40;
                        uVar39 = -uVar37;
                        if (0 < (long)uVar37) {
                          uVar39 = uVar37;
                        }
                        uVar37 = uVar13 * 0x14;
                        local_108 = lVar7;
                        local_d8 = uVar44;
                        if ((uVar13 < 6) || (uVar37 < uVar39)) {
                          local_3d = (long)puVar6 < (long)local_88;
                          uVar29 = local_70;
                          if ((int)local_70 < 0) {
                            uVar29 = uVar9;
                          }
                          if ((local_a0[(int)uVar9] & 3U) == 1) {
                            local_6c = uVar9;
                            local_70 = uVar29;
                          }
                          bVar45 = true;
                          local_100 = uVar37;
                          if ((lVar40 < local_110 == (bool)local_3d) && (uVar20 <= uVar39)) {
                            uVar20 = (ulong)local_6c;
                            uVar27 = local_70;
                            goto LAB_00232956;
                          }
                        }
                        else {
                          bVar45 = false;
                        }
                      }
                    } while (uVar9 != uVar25);
                  }
                }
                goto LAB_00232685;
              }
              bVar45 = false;
              goto LAB_0023271c;
            }
            goto LAB_00232798;
          }
          local_58 = uVar34;
          if ((lVar18 != -0x80000000) && (lVar18 != 0x7fffffff)) {
            if ((char)local_34 == '\0') {
              uVar25 = (uint)uVar34;
              pFVar19 = (FT_Pos *)auStack_c3c8;
              uVar34 = (ulong)(uVar25 + 1);
            }
            else {
              uVar25 = (uint)uVar17;
              pFVar19 = &dummy[0].axis[1].org_delta;
              uVar17 = (ulong)(uVar25 + 1);
            }
            pFVar19[uVar25] = lVar18;
            local_58 = uVar34;
          }
        }
      }
      FVar22 = (FT_UInt)uVar17;
      if ((int)local_58 != 0 || FVar22 != 0) {
        af_sort_pos(FVar22,&dummy[0].axis[1].org_delta);
        af_sort_pos((FT_UInt)local_58,(FT_Pos *)auStack_c3c8);
        uVar25 = local_50->axis[1].blue_count;
        pAVar23 = local_d0 + uVar25;
        local_50->axis[1].blue_count = uVar25 + 1;
        uVar3 = local_a8->properties;
        if ((int)local_58 == 0) {
          lVar18 = *(long *)((long)hints[0].axis[0].embedded.segments +
                            (ulong)(FVar22 >> 1) * 8 + -0x78);
LAB_00232aed:
          (pAVar23->shoot).org = lVar18;
          (pAVar23->ref).org = lVar18;
        }
        else {
          lVar18 = *(long *)((long)dummy[0].axis[0].widths +
                            (local_58 >> 1 & 0x7fffffff) * 8 + -0x70);
          if (FVar22 == 0) goto LAB_00232aed;
          (pAVar23->ref).org = lVar18;
          lVar36 = *(long *)((long)hints[0].axis[0].embedded.segments +
                            (ulong)(FVar22 >> 1) * 8 + -0x78);
          (pAVar23->shoot).org = lVar36;
          if ((lVar36 != lVar18) && (lVar36 <= lVar18 == ((uVar3 & 3) != 0))) {
            lVar18 = (lVar36 + lVar18) / 2;
            goto LAB_00232aed;
          }
        }
        pAVar23->ascender = lVar28;
        pAVar23->descender = lVar31;
        uVar25 = (uint)uVar3 + (uint)uVar3 & 0xe;
        pAVar23->flags = uVar25;
        if ((uVar3 & 8) != 0) {
          pAVar23->flags = uVar25 | 0x10;
        }
      }
      pAVar43 = local_a8 + 1;
      metrics_00 = local_50;
    }
    af_shaper_buf_destroy(pFVar26,local_c0);
    uVar29 = metrics_00->axis[1].blue_count;
    if ((ulong)uVar29 != 0) {
      pAVar23 = local_d0;
      for (uVar17 = 0; uVar29 != uVar17; uVar17 = uVar17 + 1) {
        *(AF_LatinBlueRec **)(local_168 + uVar17 * 2) = pAVar23;
        pAVar23 = pAVar23 + 1;
      }
      for (; uVar24 = uVar25, uVar25 != uVar29; uVar25 = uVar25 + 1) {
        while (uVar16 = uVar24 - 1, uVar24 != 0) {
          plVar12 = *(long **)(local_168 + (ulong)uVar16 * 2);
          plVar35 = plVar12;
          if ((*(byte *)(plVar12 + 8) & 6) == 0) {
            plVar35 = plVar12 + 3;
          }
          plVar8 = *(long **)(local_168 + (ulong)uVar24 * 2);
          plVar41 = plVar8 + 3;
          if ((*(byte *)(plVar8 + 8) & 6) != 0) {
            plVar41 = plVar8;
          }
          if (*plVar35 <= *plVar41) break;
          *(long **)(local_168 + (ulong)uVar24 * 2) = plVar12;
          *(long **)(local_168 + (ulong)uVar16 * 2) = plVar8;
          uVar24 = uVar16;
        }
      }
      for (uVar17 = 0; uVar29 - 1 != uVar17; uVar17 = uVar17 + 1) {
        lVar28 = *(long *)(local_168 + uVar17 * 2);
        lVar31 = 0x18;
        if ((*(byte *)(lVar28 + 0x40) & 6) == 0) {
          lVar31 = 0;
        }
        plVar12 = *(long **)(&num_idx_1 + uVar17 * 2);
        if ((*(byte *)(plVar12 + 8) & 6) != 0) {
          plVar12 = plVar12 + 3;
        }
        if (*plVar12 < *(long *)(lVar28 + lVar31)) {
          *(long *)(lVar28 + lVar31) = *plVar12;
        }
      }
    }
    dummy[0].axis[1].org_delta = 0;
    p = auStack_c3c8;
    auStack_c3c8 = (uint  [2])0x2033203220312030;
    dummy[0].root.style_class = (AF_StyleClass)0x2037203620352034;
    dummy[0].root.scaler.face = (FT_Face)CONCAT44(dummy[0].root.scaler.face._4_4_,0x392038);
    buf_ = af_shaper_buf_create(pFVar26);
    bVar45 = true;
    local_48 = (AF_LatinAxisRec *)0x0;
    do {
      while( true ) {
        do {
          if ((char)*p == '\0') {
            bVar45 = true;
            goto LAB_00232ca8;
          }
          p = (uint *)af_shaper_get_cluster((char *)p,&local_50->root,buf_,local_168);
        } while ((1 < local_168[0]) ||
                (FVar14 = af_shaper_get_elem(&local_50->root,buf_,idx,&dummy[0].axis[1].org_delta,
                                             (FT_Long *)0x0), FVar14 == 0));
        if (!bVar45) break;
        bVar45 = false;
        local_48 = (AF_LatinAxisRec *)dummy[0].axis[1].org_delta;
      }
      bVar45 = false;
    } while ((AF_LatinAxisRec *)dummy[0].axis[1].org_delta == local_48);
LAB_00232ca8:
    face = local_60;
    af_shaper_buf_destroy(local_60,buf_);
    (local_50->root).digits_have_same_width = bVar45;
    charmap = local_e0;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
LAB_00232956:
  do {
    uVar29 = (int)uVar44 + 1;
    if ((int)(uint)local_48 <= (int)uVar44) {
      uVar29 = local_38;
    }
    uVar44 = (ulong)uVar29;
    uVar39 = local_90[(int)uVar29].y - lVar7;
    uVar13 = -uVar39;
    if (0 < (long)uVar39) {
      uVar13 = uVar39;
    }
    lVar36 = lVar7;
    uVar32 = local_94;
    if (5 < uVar13) {
      uVar39 = local_90[(int)uVar24].x - lVar40;
      uVar13 = -uVar39;
      if (0 < (long)uVar39) {
        uVar13 = uVar39;
      }
      if (uVar13 <= uVar37) {
        uVar16 = (uint)uVar20;
        uVar15 = (uint)local_48;
        if ((int)local_38 < (int)uVar29) {
          uVar15 = uVar29 - 1;
        }
        break;
      }
    }
    uVar16 = uVar27;
    if ((int)uVar27 < 0) {
      uVar16 = uVar29;
    }
    if ((local_a0[(int)uVar29] & 3U) == 1) {
      uVar27 = uVar16;
    }
    uVar20 = uVar44;
    uVar16 = uVar25;
    uVar15 = uVar25;
  } while (uVar29 != uVar25);
LAB_00232685:
  if (((int)uVar27 < 0) || ((int)uVar16 < 0)) {
LAB_002326cb:
    if ((local_a0[(int)uVar32] & 3U) == 1) {
      bVar46 = (local_a0[(int)uVar15] & 3U) == 1;
      bVar45 = !bVar46;
      if (bVar46) goto LAB_0023271c;
      bVar46 = (short)local_c4 == 0;
    }
    else {
      bVar45 = true;
      bVar46 = (local_74 & 4) == 0;
    }
    if (!bVar46) goto LAB_00232798;
  }
  else {
    uVar13 = local_90[uVar16].x - local_90[uVar27].x;
    uVar20 = -uVar13;
    if (0 < (long)uVar13) {
      uVar20 = uVar13;
    }
    if (uVar20 <= local_f8) goto LAB_002326cb;
    bVar45 = false;
  }
LAB_0023271c:
  if ((local_74 & 1) == 0) {
    local_34 = local_34 & 0xff;
    if (lVar36 < local_80) {
      lVar18 = lVar36;
      local_34 = (uint)bVar45;
    }
  }
  else {
    local_34 = local_34 & 0xff;
    if (local_80 < lVar36) {
      lVar18 = lVar36;
      local_34 = (uint)bVar45;
    }
  }
LAB_00232798:
  FVar22 = FVar22 + 1;
  goto LAB_00232393;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_metrics_init( AF_LatinMetrics  metrics,
                         FT_Face          face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_latin_metrics_init_widths( metrics, face );
      af_latin_metrics_init_blues( metrics, face );
      af_latin_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }